

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

int __thiscall
CVmObjStringBuffer::compare_to(CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *val)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *str;
  int *piVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  
  if (val->typ == VM_OBJ) {
    iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                       metaclass_reg_);
    if (iVar4 != 0) {
      piVar6 = (int *)(this->super_CVmObject).ext_;
      iVar4 = *piVar6;
      piVar2 = *(int **)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][(val->val).obj & 0xfff].
                                ptr_ + 8);
      iVar1 = *piVar2;
      iVar3 = iVar1;
      if (iVar4 < iVar1) {
        iVar3 = iVar4;
      }
      iVar5 = iVar4 - iVar1;
      if (0 < iVar3) {
        iVar9 = piVar6[3];
        iVar10 = piVar2[3];
        if (iVar9 < iVar10) {
          piVar6 = (int *)0xffffffff;
          bVar7 = false;
        }
        else {
          lVar8 = 0;
          bVar7 = false;
          do {
            if (iVar10 < iVar9) {
              piVar6 = (int *)0x1;
              goto LAB_002b2f34;
            }
            bVar7 = iVar3 <= (int)lVar8 + 1;
            if (iVar3 + -1 == (int)lVar8) goto LAB_002b2f34;
            iVar9 = piVar6[lVar8 + 4];
            iVar10 = piVar2[lVar8 + 4];
            lVar8 = lVar8 + 1;
          } while (iVar10 <= iVar9);
          piVar6 = (int *)0xffffffff;
        }
LAB_002b2f34:
        if (!bVar7) {
          iVar5 = (int)piVar6;
        }
      }
      return iVar5;
    }
  }
  str = vm_val_t::get_as_string(val);
  if (str != (char *)0x0) {
    iVar4 = compare_str(this,str);
    return iVar4;
  }
  err_throw(0x7d9);
}

Assistant:

int CVmObjStringBuffer::compare_to(VMG_ vm_obj_id_t self,
                                   const vm_val_t *val) const
{
    /* 
     *   we can compare our contents to another string buffer, or to a
     *   regular string object 
     */
    const char *str;
    if (val->typ == VM_OBJ && is_string_buffer_obj(vmg_ val->val.obj))
    {
        /* compare the buffers character by character */
        CVmObjStringBuffer *other =
            (CVmObjStringBuffer *)vm_objp(vmg_ val->val.obj);
        int32_t len1 = get_ext()->len, len2 = other->get_ext()->len;
        const wchar_t *buf1 = get_ext()->buf, *buf2 = other->get_ext()->buf;
        for (int32_t i = 0 ; i < len1 && i < len2 ; ++i, ++buf1, ++buf2)
        {
            if (*buf1 < *buf2)
                return -1;
            else if (*buf1 > *buf2)
                return 1;
        }

        /* 
         *   They're equal up to the full length of the shorter string.  If
         *   we ran out of strings at the same time, they're equal; otherwise
         *   the longer string compares greater 
         */
        return len1 - len2;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* compare to a constant string */
        return compare_str(str);
    }
    else
    {
        /* the other value isn't comparable to string */
        err_throw(VMERR_INVALID_COMPARISON);
        AFTER_ERR_THROW(return 0;)
    }
}